

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void duckdb::PhysicalJoin::ConstructSemiJoinResult
               (DataChunk *left,DataChunk *result,bool *found_match)

{
  idx_t iVar1;
  idx_t count_p;
  idx_t iVar2;
  SelectionVector sel;
  SelectionVector local_38;
  
  SelectionVector::SelectionVector(&local_38,0x800);
  iVar1 = left->count;
  count_p = 0;
  for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    if (found_match[iVar2] == true) {
      local_38.sel_vector[count_p] = (sel_t)iVar2;
      count_p = count_p + 1;
    }
  }
  if (count_p == 0) {
    result->count = 0;
  }
  else {
    DataChunk::Slice(result,left,&local_38,count_p,0);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PhysicalJoin::ConstructSemiJoinResult(DataChunk &left, DataChunk &result, bool found_match[]) {
	ConstructSemiOrAntiJoinResult<true>(left, result, found_match);
}